

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListIteratorTest_crbegin_crend_forward_Test::TestBody
          (IntrusiveListIteratorTest_crbegin_crend_forward_Test *this)

{
  intrusive_list<(anonymous_namespace)::TestObject> *piVar1;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_88
  ;
  TestObject *local_78;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_70
  ;
  TestObjectList *local_60;
  undefined8 local_58;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_50
  ;
  TestObjectList *local_40;
  undefined8 local_38;
  
  local_50.current.list_ = &(this->super_IntrusiveListIteratorTest).list_;
  local_38 = 0;
  local_50.current.node_ = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_78 = (TestObject *)0x0;
  local_88.current.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)0x0;
  local_88.current.node_ = (TestObject *)0x0;
  local_40 = local_50.current.list_;
  piVar1 = (intrusive_list<(anonymous_namespace)::TestObject> *)operator_new(0xc);
  local_88.current.node_ = (TestObject *)((long)&piVar1->last_ + 4);
  piVar1->first_ = (TestObject *)0x200000003;
  *(undefined4 *)&piVar1->last_ = 1;
  local_88.current.list_ = piVar1;
  local_78 = local_88.current.node_;
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestForward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)&local_40,&local_50,&local_88,
             (vector<int,_std::allocator<int>_> *)0x1);
  operator_delete(piVar1);
  local_70.current.list_ = (this->super_IntrusiveListIteratorTest).clist_;
  local_58 = 0;
  local_70.current.node_ = (local_70.current.list_)->first_;
  local_78 = (TestObject *)0x0;
  local_88.current.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)0x0;
  local_88.current.node_ = (TestObject *)0x0;
  local_60 = local_70.current.list_;
  piVar1 = (intrusive_list<(anonymous_namespace)::TestObject> *)operator_new(0xc);
  local_88.current.node_ = (TestObject *)((long)&piVar1->last_ + 4);
  piVar1->first_ = (TestObject *)0x200000003;
  *(undefined4 *)&piVar1->last_ = 1;
  local_88.current.list_ = piVar1;
  local_78 = local_88.current.node_;
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestForward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)&local_60,&local_70,&local_88,
             (vector<int,_std::allocator<int>_> *)0x1);
  operator_delete(piVar1);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, crbegin_crend_forward) {
  TestForward(list_.crbegin(), list_.crend(), {3, 2, 1});
  TestForward(clist_.crbegin(), clist_.crend(), {3, 2, 1});
}